

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfImage.cpp
# Opt level: O1

int __thiscall Imf_3_2::Image::levelWidth(Image *this,int lx)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  ArgExc *this_00;
  int iVar4;
  stringstream _iex_throw_s;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  if ((-1 < lx) && (lx < (int)(this->_levels)._sizeY)) {
    iVar2 = (this->_dataWindow).max.x;
    iVar1 = (this->_dataWindow).min.x;
    iVar4 = iVar2 - iVar1;
    if (iVar2 < iVar1) {
      iVar2 = 0;
    }
    else {
      iVar2 = (iVar4 + 1) / (1 << ((byte)lx & 0x1f));
      iVar2 = iVar2 + (uint)(iVar2 << ((byte)lx & 0x1f) <= iVar4 &&
                            this->_levelRoundingMode == ROUND_UP);
      if (iVar2 < 2) {
        iVar2 = 1;
      }
    }
    return iVar2;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(asStack_198);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_188,"Cannot get level width for invalid image level number ",0x36);
  poVar3 = (ostream *)std::ostream::operator<<(local_188,lx);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,".",1);
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_2::ArgExc::ArgExc(this_00,asStack_198);
  __cxa_throw(this_00,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
}

Assistant:

int
Image::levelWidth (int lx) const
{
    if (lx < 0 || lx >= numXLevels ())
    {
        THROW (
            ArgExc,
            "Cannot get level width for invalid "
            "image level number "
                << lx << ".");
    }

    return levelSize (
        _dataWindow.min.x, _dataWindow.max.x, lx, _levelRoundingMode);
}